

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLinOp::solutionResidual
          (MLNodeLinOp *this,int amrlev,MultiFab *resid,MultiFab *x,MultiFab *b,MultiFab *param_5)

{
  uint uVar1;
  FabArray<amrex::IArrayBox> *this_00;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  MLMGBndry *in_stack_fffffffffffffe20;
  long local_1d0;
  Box local_16c;
  Array4<const_double> local_150;
  Array4<double> local_110;
  Array4<const_int> local_d0;
  MFIter mfi;
  
  uVar1 = (b->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  apply(this,amrlev,0,resid,x,Inhomogeneous,Solution,in_stack_fffffffffffffe20);
  this_00 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(this->m_dirichlet_mask).
               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[amrlev].
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  MFIter::MFIter(&mfi,(FabArrayBase *)resid,true);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::tilebox(&local_16c,&mfi);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_110,&resid->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_150,&b->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_d0,this_00,&mfi);
    lVar3 = (long)local_16c.smallend.vect[0] * 8;
    local_1d0 = 0;
    uVar5 = 0;
    while( true ) {
      lVar8 = (long)local_16c.smallend.vect[2];
      if (uVar5 == uVar1) break;
      for (; (int)lVar8 <= local_16c.bigend.vect[2]; lVar8 = lVar8 + 1) {
        lVar7 = (long)local_d0.p +
                ((long)local_16c.smallend.vect[1] - (long)local_d0.begin.y) * local_d0.jstride * 4 +
                (lVar8 - local_d0.begin.z) * local_d0.kstride * 4 + (long)local_d0.begin.x * -4 +
                (long)local_16c.smallend.vect[0] * 4;
        for (lVar4 = (long)local_16c.smallend.vect[1]; lVar4 <= local_16c.bigend.vect[1];
            lVar4 = lVar4 + 1) {
          if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
            lVar2 = local_110.nstride * local_1d0 +
                    (lVar4 - local_110.begin.y) * local_110.jstride * 8 +
                    (lVar8 - local_110.begin.z) * local_110.kstride * 8 +
                    (long)local_110.begin.x * -8 + lVar3;
            lVar6 = 0;
            do {
              if (*(int *)(lVar7 + lVar6 * 4) == 0) {
                *(double *)((long)local_110.p + lVar6 * 8 + lVar2) =
                     *(double *)
                      ((long)local_150.p +
                      lVar6 * 8 +
                      local_150.nstride * local_1d0 +
                      (lVar4 - local_150.begin.y) * local_150.jstride * 8 +
                      (lVar8 - local_150.begin.z) * local_150.kstride * 8 +
                      (long)local_150.begin.x * -8 + lVar3) -
                     *(double *)((long)local_110.p + lVar6 * 8 + lVar2);
              }
              else {
                *(undefined8 *)((long)local_110.p + lVar6 * 8 + lVar2) = 0;
              }
              lVar6 = lVar6 + 1;
            } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 != (int)lVar6);
          }
          lVar7 = lVar7 + local_d0.jstride * 4;
        }
      }
      uVar5 = uVar5 + 1;
      local_1d0 = local_1d0 + 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MLNodeLinOp::solutionResidual (int amrlev, MultiFab& resid, MultiFab& x, const MultiFab& b,
                               const MultiFab* /*crse_bcdata*/)
{
    const int mglev = 0;
    const int ncomp = b.nComp();
    apply(amrlev, mglev, resid, x, BCMode::Inhomogeneous, StateMode::Solution);

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][0];
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(resid, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& res = resid.array(mfi);
        Array4<Real const> const& bb = b.const_array(mfi);
        Array4<int const> const& dd = dmsk.const_array(mfi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            if (dd(i,j,k)) {
                res(i,j,k,n) = 0.0;
            } else {
                res(i,j,k,n) = bb(i,j,k,n) - res(i,j,k,n);
            }
        });
    }
}